

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings(FastText *this,int32_t cutoff)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  anon_class_16_2_b239f476 __comp;
  int32_t iVar1;
  Dictionary *this_00;
  const_iterator in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int32_t eosid;
  Vector norms;
  vector<int,_std::allocator<int>_> *idx;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Matrix *in_stack_ffffffffffffff18;
  allocator_type *__a;
  Matrix *in_stack_ffffffffffffff20;
  const_iterator __last;
  pointer *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff50;
  allocator_type local_45;
  undefined4 local_44;
  undefined1 local_3d;
  int local_30 [12];
  
  this_01 = &(((Vector *)((long)in_RSI._M_current + 0x18))->data_).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  __last._M_current = (int *)in_RDI;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x175206);
  Matrix::size(in_stack_ffffffffffffff18,
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  __last_00._M_current = local_30;
  Vector::Vector((Vector *)this_01,(int64_t)in_RSI._M_current);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x175231);
  Matrix::l2NormRow(in_stack_ffffffffffffff20,(Vector *)in_stack_ffffffffffffff18);
  local_3d = 0;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x175256);
  this_00 = (Dictionary *)
            Matrix::size(in_stack_ffffffffffffff18,
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_44 = 0;
  __a = &local_45;
  std::allocator<int>::allocator((allocator<int> *)0x175286);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__last._M_current,(size_type)in_RDI,
             (value_type_conflict *)this_00,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x1752b1);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08._M_current);
  __first._M_current._4_4_ = in_stack_ffffffffffffff14;
  __first._M_current._0_4_ = in_stack_ffffffffffffff10;
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first,in_stack_ffffffffffffff08,0);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1752fc);
  iVar1 = Dictionary::getId(this_00,(string *)__a);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08._M_current);
  __comp._8_8_ = this_01;
  __comp.norms = (Vector *)in_RSI._M_current;
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,fasttext::FastText::selectEmbeddings(int)const::__0>
            (in_stack_ffffffffffffff50,__last_00,__comp);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08._M_current);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)__a,
             CONCAT44(iVar1,in_stack_ffffffffffffff10));
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff10),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffff08._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08._M_current);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff10),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffff08._M_current);
  std::vector<int,_std::allocator<int>_>::erase(in_RDI,in_RSI,__last);
  local_3d = 1;
  Vector::~Vector((Vector *)0x175478);
  return (vector<int,_std::allocator<int>_> *)__last._M_current;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
	Vector norms(input_->size(0));
	input_->l2NormRow(norms);
	std::vector<int32_t> idx(input_->size(0), 0);
	std::iota(idx.begin(), idx.end(), 0);
	auto eosid = dict_->getId(Dictionary::EOS);
	std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
		return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
	});
	idx.erase(idx.begin() + cutoff, idx.end());
	return idx;
}